

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O3

void wipe_mon_list(chunk *c,player *p)

{
  object **ppoVar1;
  object *obj;
  loc grid;
  ghost_info *pgVar2;
  bool bVar3;
  _Bool _Var4;
  wchar_t wVar5;
  monster *__s;
  monster_race *pmVar6;
  monster_lore *pmVar7;
  angband_constants *paVar8;
  chunk *p_c;
  object *obj_00;
  ulong uVar9;
  
  wVar5 = cave_monster_max((chunk_conflict *)c);
  if (L'\x01' < wVar5) {
    do {
      __s = cave_monster((chunk_conflict *)c,wVar5 + L'\xffffffff');
      if ((__s != (monster *)0x0) && (__s->race != (monster_race *)0x0)) {
        obj = __s->held_obj;
        obj_00 = obj;
        if (obj != (object *)0x0) {
          do {
            if ((obj_00->artifact != (artifact *)0x0) &&
               (_Var4 = obj_is_known_artifact(obj_00), !_Var4)) {
              mark_artifact_created(obj_00->artifact,false);
            }
            if ((ulong)obj_00->oidx != 0) {
              c->objects[obj_00->oidx] = (object *)0x0;
            }
            ppoVar1 = &obj_00->next;
            obj_00 = *ppoVar1;
          } while (*ppoVar1 != (object *)0x0);
          if (p == (player *)0x0) {
            p_c = (chunk *)0x0;
          }
          else {
            p_c = (chunk *)0x0;
            if ((chunk *)cave == c) {
              p_c = (chunk *)p->cave;
            }
          }
          object_pile_free(c,p_c,obj);
        }
        pmVar6 = __s->original_race;
        if (pmVar6 == (monster_race *)0x0) {
          pmVar6 = __s->race;
        }
        pmVar6->cur_num = pmVar6->cur_num + L'\xffffffff';
        grid.x = (__s->grid).x;
        grid.y = (__s->grid).y;
        square_set_mon((chunk_conflict *)c,grid,L'\0');
        _Var4 = flag_has_dbg(__s->race->flags,0xc,2,"mon->race->flags","RF_PLAYER_GHOST");
        if (_Var4) {
          pmVar7 = get_lore(__s->race);
          pmVar7->sights = 0;
          pmVar7->deaths = 0;
          pmVar7->pkills = 0;
          pmVar7->tkills = 0;
          pgVar2 = c->ghost;
          pgVar2->bones_selector = L'\0';
          pgVar2->has_spoken = false;
          my_strcpy(pgVar2->name,"",0x50);
          my_strcpy(c->ghost->string,"",0x50);
          c->ghost->string_type = L'\0';
          if (player->upkeep->monster_race == __s->race) {
            player->upkeep->monster_race = (monster_race *)0x0;
          }
        }
        memset(__s,0,0x1f0);
      }
      bVar3 = L'\x02' < wVar5;
      wVar5 = wVar5 + L'\xffffffff';
    } while (bVar3);
  }
  mem_free(r_info[(ulong)z_info->r_max - 1].blow);
  memset(r_info + ((ulong)z_info->r_max - 1),0,0xd0);
  if (1 < z_info->level_monster_max) {
    uVar9 = 1;
    paVar8 = z_info;
    do {
      if (c->monster_groups[uVar9] != (monster_group *)0x0) {
        monster_group_free((chunk_conflict *)c,c->monster_groups[uVar9]);
        paVar8 = z_info;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < paVar8->level_monster_max);
  }
  c->mon_max = 1;
  c->mon_cnt = 0;
  c->num_repro = L'\0';
  target_set_monster((monster *)0x0);
  health_track(p->upkeep,(monster *)0x0);
  return;
}

Assistant:

void wipe_mon_list(struct chunk *c, struct player *p)
{
	int m_idx, i;

	/* Delete all the monsters */
	for (m_idx = cave_monster_max(c) - 1; m_idx >= 1; m_idx--) {
		struct monster *mon = cave_monster(c, m_idx);
		struct object *held_obj = mon ? mon->held_obj : NULL;

		/* Skip dead monsters */
		if (!mon->race) continue;

		/* Delete all the objects */
		if (held_obj) {
			/* Go through all held objects and check for artifacts */
			struct object *obj = held_obj;
			while (obj) {
				if (obj->artifact && !obj_is_known_artifact(obj)) {
					mark_artifact_created(obj->artifact,
						false);
				}
				/*
				 * Also, remove from the cave's object list.
				 * That way, the scan for orphaned objects
				 * in cave_free() doesn't attempt to
				 * access freed memory or free memory
				 * twice.
				 */
				if (obj->oidx) {
					c->objects[obj->oidx] = NULL;
				}
				obj = obj->next;
			}
			object_pile_free(c, (p && c == cave) ? p->cave : NULL,
				held_obj);
		}

		/* Reduce the racial counter */
		if (mon->original_race) mon->original_race->cur_num--;
		else mon->race->cur_num--;

		/* Monster is gone from square */
		square_set_mon(c, mon->grid, 0);

		/* If the monster was a player ghost, remove it from the monster memory,
		 * ensure that it never appears again, clear its data and allow the
		 * next ghost to speak. */
		if (rf_has(mon->race->flags, RF_PLAYER_GHOST)) {
			struct monster_lore *lore = get_lore(mon->race);
			lore->sights = 0;
			lore->deaths = 0;
			lore->pkills = 0;
			lore->tkills = 0;
			c->ghost->bones_selector = 0;
			c->ghost->has_spoken = false;
			my_strcpy(c->ghost->name, "", sizeof(c->ghost->name));
			my_strcpy(c->ghost->string, "", sizeof(c->ghost->string));
			c->ghost->string_type = 0;
			if (player->upkeep->monster_race == mon->race) {
				player->upkeep->monster_race = NULL;
			}
		}

		/* Wipe the Monster */
		memset(mon, 0, sizeof(struct monster));
	}

	/* Delete the player ghost record completely */
	mem_free(r_info[PLAYER_GHOST_RACE].blow);
	memset(&r_info[PLAYER_GHOST_RACE], 0, sizeof(struct monster_race));

	/* Delete all the monster groups */
	for (i = 1; i < z_info->level_monster_max; i++) {
		if (c->monster_groups[i]) {
			monster_group_free(c, c->monster_groups[i]);
		}
	}

	/* Reset "cave->mon_max" */
	c->mon_max = 1;

	/* Reset "mon_cnt" */
	c->mon_cnt = 0;

	/* Reset "reproducer" count */
	c->num_repro = 0;

	/* Hack -- no more target */
	target_set_monster(0);

	/* Hack -- no more tracking */
	health_track(p->upkeep, 0);
}